

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::set_help_flag(App *this,string *name,string *description)

{
  Option *pOVar1;
  string sStack_58;
  string local_38;
  
  if (this->help_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_ptr_);
    this->help_ptr_ = (Option *)0x0;
  }
  if (name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_38,(string *)name);
    ::std::__cxx11::string::string((string *)&sStack_58,(string *)description);
    pOVar1 = add_flag(this,&local_38,&sStack_58);
    this->help_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&sStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
    pOVar1 = this->help_ptr_;
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar1;
}

Assistant:

Option *set_help_flag(std::string name = "", std::string description = "") {
        if(help_ptr_ != nullptr) {
            remove_option(help_ptr_);
            help_ptr_ = nullptr;
        }

        // Empty name will simply remove the help flag
        if(!name.empty()) {
            help_ptr_ = add_flag(name, description);
            help_ptr_->configurable(false);
        }

        return help_ptr_;
    }